

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O3

void __thiscall RDNSequence::Encode(RDNSequence *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  size_t cbOut_00;
  ulong uVar1;
  long lVar2;
  pointer pRVar3;
  uchar *pOut_00;
  undefined1 auStack_58 [8];
  EncodeHelper eh;
  
  auStack_58 = (undefined1  [8])0x0;
  eh.offset = 0;
  eh.cbNeeded = 0;
  uVar1 = (this->super_DerBase).cbData;
  lVar2 = 2;
  if ((((0x7f < uVar1) && (lVar2 = 3, 0xff < uVar1)) && (lVar2 = 4, 0xffff < uVar1)) &&
     (((lVar2 = 5, 0xffffff < uVar1 && (lVar2 = 6, uVar1 >> 0x20 != 0)) &&
      (lVar2 = 7, uVar1 >> 0x28 != 0)))) {
    lVar2 = (ulong)(uVar1 >> 0x30 == 0) << 3;
  }
  eh.cbCurrent = (size_t)cbUsed;
  EncodeHelper::Init((EncodeHelper *)auStack_58,lVar2 + uVar1,pOut,cbOut,'0',uVar1);
  pRVar3 = (this->name).
           super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->name).
      super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar3) {
    lVar2 = 0x10;
    uVar1 = 0;
    do {
      pOut_00 = pOut + (long)auStack_58;
      cbOut_00 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
      EncodeSetOrSequenceOf<AttributeTypeAndValue>
                (ConstructedSet,
                 (vector<AttributeTypeAndValue,_std::allocator<AttributeTypeAndValue>_> *)
                 ((long)&(pRVar3->super_DerBase)._vptr_DerBase + lVar2),pOut_00,cbOut_00,
                 &eh.cbNeeded);
      auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
      eh.cbNeeded = 0;
      uVar1 = uVar1 + 1;
      pRVar3 = (this->name).
               super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x28;
    } while (uVar1 < (ulong)(((long)(this->name).
                                    super__Vector_base<RelativeDistinguishedName,_std::allocator<RelativeDistinguishedName>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar3 >> 3)
                            * -0x3333333333333333));
    eh.cbNeeded = 0;
  }
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  EncodeHelper::CheckExit((EncodeHelper *)auStack_58);
  *(undefined1 (*) [8])eh.cbCurrent = auStack_58;
  return;
}

Assistant:

virtual void Encode(unsigned char* pOut, size_t cbOut, size_t& cbUsed) override
	{
        EncodeHelper eh(cbUsed);

        eh.Init(EncodedSize(), pOut, cbOut, static_cast<unsigned char>(DerType::ConstructedSequence), cbData);

        // This is a sequence of sets of AttributeTypeAndValue
        for (size_t item = 0; item < name.size(); ++item)
        {
            name[item].Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
            eh.Update();
        }

		eh.Finalize();
	}